

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntestc.c
# Opt level: O2

void fill_patch(double *ptr,int *dim,int *ld,int ndim,double val)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  if (ndim == 0) {
    GA_Error("fill_patch: error",0);
  }
  else if (ndim != 1) {
    if (ndim == 2) {
      uVar2 = *dim;
      if (*dim < 1) {
        uVar2 = 0;
      }
      for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
        uVar1 = dim[1];
        if (dim[1] < 1) {
          uVar1 = 0;
        }
        iVar6 = *ld;
        for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
          ptr[(long)(int)(iVar6 * uVar3) + uVar7] = val;
        }
      }
      return;
    }
    uVar2 = ndim - 1;
    uVar7 = 0;
    uVar4 = 0;
    if (0 < (int)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    iVar6 = 1;
    for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      iVar6 = iVar6 * ld[uVar7];
    }
    for (lVar5 = 0; lVar5 < *dim; lVar5 = lVar5 + 1) {
      fill_patch(ptr,dim + 1,ld + 1,uVar2,val);
      ptr = ptr + iVar6;
    }
    return;
  }
  uVar4 = 0;
  uVar7 = (ulong)(uint)*dim;
  if (*dim < 1) {
    uVar7 = uVar4;
  }
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    ptr[uVar4] = val;
  }
  return;
}

Assistant:

void fill_patch(double *ptr, int dim[], int ld[], int ndim, double val)
{
     int i, j, stride=1;

     switch (ndim){
     case 0: GA_Error("fill_patch: error",ndim);
     case 1: for(i=0;i <dim[0];i++)ptr[i]=val;
             break;
     case 2: for(i=0; i< dim[0]; i++){
               double *arr = ptr + i*ld[0];
               for(j=0; j< dim[1]; j++)arr[j]=val; 
             }
             break;
     default: 
             for(i=0; i<ndim-1; i++)stride *=ld[i];
             for(i=0; i<dim[0]; i++){
                 double *arr = ptr + stride*i;
                 fill_patch(arr, dim+1, ld+1, ndim-1, val);
             } 
     }
}